

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.h
# Opt level: O1

void __thiscall
embree::sse2::CurveGeometryInterface<embree::CatmullRomCurveT>::interpolate_impl<4>
          (CurveGeometryInterface<embree::CatmullRomCurveT> *this,RTCInterpolateArguments *args)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  uint uVar4;
  uint uVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  char *pcVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  vector<BufferView<Vec3ff>_> *pvVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  
  uVar4 = args->valueCount;
  pvVar13 = &(this->super_CurveGeometry).vertices;
  if (args->bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
    pvVar13 = (vector<BufferView<Vec3ff>_> *)&(this->super_CurveGeometry).vertexAttribs;
  }
  if ((ulong)uVar4 != 0) {
    fVar17 = args->u;
    fVar18 = 1.0 - fVar17;
    fVar39 = fVar17 * 3.0;
    pfVar6 = args->P;
    pfVar7 = args->dPdu;
    pfVar8 = args->ddPdudu;
    pcVar9 = pvVar13->items[args->bufferSlot].super_RawBufferView.ptr_ofs;
    uVar15 = (ulong)(uint)pvVar13->items[args->bufferSlot].super_RawBufferView.stride;
    uVar5 = args->primID;
    fVar32 = -fVar17 * fVar18 * fVar18 * 0.5;
    fVar33 = (fVar17 * fVar17 * (fVar39 + -5.0) + 2.0) * 0.5;
    fVar37 = ((fVar18 * 3.0 + -5.0) * fVar18 * fVar18 + 2.0) * 0.5;
    fVar27 = -fVar18 * fVar17 * fVar17 * 0.5;
    fVar44 = (fVar17 * (fVar18 + fVar18) - fVar18 * fVar18) * 0.5;
    fVar35 = ((fVar17 + fVar17) * (fVar39 + -5.0) + fVar17 * fVar39) * 0.5;
    fVar36 = ((fVar39 + 2.0) * (fVar18 + fVar18) + fVar18 * -3.0 * fVar18) * 0.5;
    fVar18 = (fVar18 * -2.0 * fVar17 + fVar17 * fVar17) * 0.5;
    fVar34 = fVar17 * -3.0 + 2.0;
    fVar38 = fVar17 * 9.0 + -5.0;
    fVar17 = fVar17 * -9.0 + 4.0;
    fVar39 = fVar39 + -1.0;
    uVar16 = 0;
    do {
      uVar14 = (ulong)*(uint *)(*(long *)&(this->super_CurveGeometry).super_Geometry.field_0x58 +
                               *(long *)&(this->super_CurveGeometry).field_0x68 * (ulong)uVar5);
      uVar43 = (uint)uVar16;
      uVar40 = -(uint)((int)uVar43 < (int)uVar4);
      uVar41 = -(uint)((int)(uVar43 | 1) < (int)uVar4);
      uVar42 = -(uint)((int)(uVar43 | 2) < (int)uVar4);
      uVar43 = -(uint)((int)(uVar43 | 3) < (int)uVar4);
      puVar1 = (uint *)(pcVar9 + uVar16 * 4 + uVar15 * uVar14);
      fVar45 = (float)(*puVar1 & uVar40);
      fVar46 = (float)(puVar1[1] & uVar41);
      fVar47 = (float)(puVar1[2] & uVar42);
      fVar48 = (float)(puVar1[3] & uVar43);
      puVar1 = (uint *)(pcVar9 + uVar16 * 4 + (uVar14 + 1) * uVar15);
      fVar28 = (float)(*puVar1 & uVar40);
      fVar29 = (float)(puVar1[1] & uVar41);
      fVar30 = (float)(puVar1[2] & uVar42);
      fVar31 = (float)(puVar1[3] & uVar43);
      puVar1 = (uint *)(pcVar9 + uVar16 * 4 + (uVar14 + 2) * uVar15);
      fVar23 = (float)(*puVar1 & uVar40);
      fVar24 = (float)(puVar1[1] & uVar41);
      fVar25 = (float)(puVar1[2] & uVar42);
      fVar26 = (float)(puVar1[3] & uVar43);
      puVar1 = (uint *)(pcVar9 + uVar16 * 4 + (uVar14 + 3) * uVar15);
      fVar19 = (float)(*puVar1 & uVar40);
      fVar20 = (float)(puVar1[1] & uVar41);
      fVar21 = (float)(puVar1[2] & uVar42);
      fVar22 = (float)(puVar1[3] & uVar43);
      if (pfVar6 != (float *)0x0) {
        pfVar2 = pfVar6 + uVar16;
        fVar10 = pfVar2[1];
        fVar11 = pfVar2[2];
        fVar12 = pfVar2[3];
        pfVar3 = pfVar6 + uVar16;
        *pfVar3 = (float)((uint)(fVar32 * fVar45 +
                                fVar33 * fVar28 + fVar37 * fVar23 + fVar27 * fVar19) & uVar40 |
                         ~uVar40 & (uint)*pfVar2);
        pfVar3[1] = (float)((uint)(fVar32 * fVar46 +
                                  fVar33 * fVar29 + fVar37 * fVar24 + fVar27 * fVar20) & uVar41 |
                           ~uVar41 & (uint)fVar10);
        pfVar3[2] = (float)((uint)(fVar32 * fVar47 +
                                  fVar33 * fVar30 + fVar37 * fVar25 + fVar27 * fVar21) & uVar42 |
                           ~uVar42 & (uint)fVar11);
        pfVar3[3] = (float)((uint)(fVar32 * fVar48 +
                                  fVar33 * fVar31 + fVar37 * fVar26 + fVar27 * fVar22) & uVar43 |
                           ~uVar43 & (uint)fVar12);
      }
      if (pfVar7 != (float *)0x0) {
        pfVar2 = pfVar7 + uVar16;
        fVar10 = pfVar2[1];
        fVar11 = pfVar2[2];
        fVar12 = pfVar2[3];
        pfVar3 = pfVar7 + uVar16;
        *pfVar3 = (float)((uint)(fVar44 * fVar45 +
                                fVar35 * fVar28 + fVar36 * fVar23 + fVar18 * fVar19) & uVar40 |
                         ~uVar40 & (uint)*pfVar2);
        pfVar3[1] = (float)((uint)(fVar44 * fVar46 +
                                  fVar35 * fVar29 + fVar36 * fVar24 + fVar18 * fVar20) & uVar41 |
                           ~uVar41 & (uint)fVar10);
        pfVar3[2] = (float)((uint)(fVar44 * fVar47 +
                                  fVar35 * fVar30 + fVar36 * fVar25 + fVar18 * fVar21) & uVar42 |
                           ~uVar42 & (uint)fVar11);
        pfVar3[3] = (float)((uint)(fVar44 * fVar48 +
                                  fVar35 * fVar31 + fVar36 * fVar26 + fVar18 * fVar22) & uVar43 |
                           ~uVar43 & (uint)fVar12);
      }
      if (pfVar8 != (float *)0x0) {
        pfVar2 = pfVar8 + uVar16;
        fVar10 = pfVar2[1];
        fVar11 = pfVar2[2];
        fVar12 = pfVar2[3];
        pfVar3 = pfVar8 + uVar16;
        *pfVar3 = (float)(~uVar40 & (uint)*pfVar2 |
                         (uint)(fVar45 * fVar34 +
                               fVar28 * fVar38 + fVar23 * fVar17 + fVar19 * fVar39) & uVar40);
        pfVar3[1] = (float)(~uVar41 & (uint)fVar10 |
                           (uint)(fVar46 * fVar34 +
                                 fVar29 * fVar38 + fVar24 * fVar17 + fVar20 * fVar39) & uVar41);
        pfVar3[2] = (float)(~uVar42 & (uint)fVar11 |
                           (uint)(fVar47 * fVar34 +
                                 fVar30 * fVar38 + fVar25 * fVar17 + fVar21 * fVar39) & uVar42);
        pfVar3[3] = (float)(~uVar43 & (uint)fVar12 |
                           (uint)(fVar48 * fVar34 +
                                 fVar31 * fVar38 + fVar26 * fVar17 + fVar22 * fVar39) & uVar43);
      }
      uVar16 = uVar16 + 4;
    } while (uVar16 < uVar4);
  }
  return;
}

Assistant:

void interpolate_impl(const RTCInterpolateArguments* const args)
    {
      unsigned int primID = args->primID;
      float u = args->u;
      RTCBufferType bufferType = args->bufferType;
      unsigned int bufferSlot = args->bufferSlot;
      float* P = args->P;
      float* dPdu = args->dPdu;
      float* ddPdudu = args->ddPdudu;
      unsigned int valueCount = args->valueCount;
      
      /* calculate base pointer and stride */
      assert((bufferType == RTC_BUFFER_TYPE_VERTEX && bufferSlot < numTimeSteps) ||
             (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE && bufferSlot <= vertexAttribs.size()));
      const char* src = nullptr; 
      size_t stride = 0;
      if (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
        src    = vertexAttribs[bufferSlot].getPtr();
        stride = vertexAttribs[bufferSlot].getStride();
      } else {
        src    = vertices[bufferSlot].getPtr();
        stride = vertices[bufferSlot].getStride();
      }

      for (unsigned int i=0; i<valueCount; i+=N)
      {
        size_t ofs = i*sizeof(float);
        const size_t index = curves[primID];
        const vbool<N> valid = vint<N>((int)i)+vint<N>(step) < vint<N>((int)valueCount);
        const vfloat<N> p0 = mem<vfloat<N>>::loadu(valid,(float*)&src[(index+0)*stride+ofs]);
        const vfloat<N> p1 = mem<vfloat<N>>::loadu(valid,(float*)&src[(index+1)*stride+ofs]);
        const vfloat<N> p2 = mem<vfloat<N>>::loadu(valid,(float*)&src[(index+2)*stride+ofs]);
        const vfloat<N> p3 = mem<vfloat<N>>::loadu(valid,(float*)&src[(index+3)*stride+ofs]);
        
        const Curve<vfloat<N>> curve(p0,p1,p2,p3);
        if (P      ) mem<vfloat<N>>::storeu(valid,P+i,      curve.eval(u));
        if (dPdu   ) mem<vfloat<N>>::storeu(valid,dPdu+i,   curve.eval_du(u));
        if (ddPdudu) mem<vfloat<N>>::storeu(valid,ddPdudu+i,curve.eval_dudu(u));
      }
    }